

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

variables_map * parseArguments(int argc,char **argv)

{
  char *pcVar1;
  typed_value<unsigned_long,_char> *ptVar2;
  size_type sVar3;
  ostream *poVar4;
  char **in_RDX;
  undefined4 in_register_0000003c;
  variables_map *this;
  unsigned_long local_110;
  basic_parsed_options<char> local_108;
  unsigned_long local_e0 [3];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c8;
  options_description options;
  
  this = (variables_map *)CONCAT44(in_register_0000003c,argc);
  std::__cxx11::string::string((string *)&local_108,"Usage",(allocator *)&local_110);
  boost::program_options::options_description::options_description
            (&options,(string *)&local_108,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&local_108);
  local_108.options.
  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_108,"test");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"benchmark");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar1,"path");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar1,"tree");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"random");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"path-complete");
  ptVar2 = boost::program_options::value<unsigned_long>(&vertices);
  local_110 = 100;
  ptVar2 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar2,&local_110);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"vertices,v",(char *)ptVar2);
  ptVar2 = boost::program_options::value<unsigned_long>(&edges);
  local_e0[2] = 0x1cc;
  ptVar2 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar2,local_e0 + 2);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"edges,e",(char *)ptVar2);
  ptVar2 = boost::program_options::value<unsigned_long>(&deletions);
  local_e0[1] = 0x32;
  ptVar2 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar2,local_e0 + 1);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"deletions,d",(char *)ptVar2);
  ptVar2 = boost::program_options::value<unsigned_long>(&queries);
  local_e0[0] = 0x32;
  ptVar2 = boost::program_options::typed_value<unsigned_long,_char>::default_value(ptVar2,local_e0);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"queries,q",(char *)ptVar2);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"example");
  boost::program_options::options_description_easy_init::operator()(pcVar1,"help");
  boost::program_options::variables_map::variables_map(this);
  local_c8.super_function_base.vtable = (vtable_base *)0x0;
  local_c8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_c8.super_function_base.functor._8_8_ = 0;
  local_c8.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>(&local_108,(int)argv,in_RDX,&options,0,&local_c8)
  ;
  boost::program_options::store((basic_parsed_options *)&local_108,this,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_108.options);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_c8);
  boost::program_options::notify(this);
  std::__cxx11::string::string((string *)&local_108,"help",(allocator *)&local_110);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)(this + 0x10),(key_type *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  if ((1 < (int)argv) && (sVar3 == 0)) {
    boost::program_options::options_description::~options_description(&options);
    return this;
  }
  poVar4 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&options);
  std::operator<<(poVar4,"\n");
  exit(1);
}

Assistant:

boost::program_options::variables_map parseArguments(int argc, char *const *argv)
{
    boost::program_options::options_description options("Usage");
    options.add_options()
            ("test", "run all tests")
            ("benchmark", "run benchmark specified benchmarks")
            ("path", "run benchmark with path graph")
            ("tree", "run benchmark with tree graph")
            ("random", "run benchmark with random graph")
            ("path-complete", "run benchmark with path of complete subgraphs")
            ("vertices,v", boost::program_options::value<unsigned long>(&vertices)
                    ->default_value(100), "specify number of vertices")
            ("edges,e", boost::program_options::value<unsigned long>(&edges)
                     ->default_value(static_cast<const unsigned long &>(100*log(100))),
             "specify number of edges (only for random graphs)")
            ("deletions,d", boost::program_options::value<unsigned long>(&deletions)
                    ->default_value(50), "specify number of deletions")
            ("queries,q", boost::program_options::value<unsigned long>(&queries)
                    ->default_value(50), "specify number of queries (default 50)")
            ("example", "run an example")
            ("help", "produce help message")
            ;

    boost::program_options::variables_map vm;
    store(parse_command_line(argc, argv, options), vm);
    notify(vm);

    if (vm.count("help") || argc < 2) {
        std::cout << options << "\n";
        exit(1);
    }

    return vm;
}